

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_trans_affine.cpp
# Opt level: O3

void __thiscall agg::trans_affine::scaling(trans_affine *this,double *x,double *y)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  dVar8 = this->shx;
  dVar10 = this->sy;
  dVar7 = this->tx;
  dVar1 = this->ty;
  dVar12 = this->shy;
  dVar2 = this->sx;
  dVar3 = rotation(this);
  dVar4 = cos(-dVar3);
  dVar5 = sin(-dVar3);
  dVar6 = sin(-dVar3);
  dVar3 = cos(-dVar3);
  dVar9 = dVar8 * dVar4 - dVar10 * dVar6;
  dVar13 = dVar8 * dVar5 + dVar10 * dVar3;
  dVar11 = dVar4 * dVar2 - dVar6 * dVar12;
  dVar8 = (dVar4 * dVar7 - dVar6 * dVar1) + 0.0;
  dVar12 = dVar5 * dVar2 + dVar3 * dVar12;
  dVar10 = dVar5 * dVar7 + dVar3 * dVar1 + 0.0;
  *x = (dVar8 + dVar9 + dVar11) - (dVar11 * 0.0 + dVar9 * 0.0 + dVar8);
  *y = (dVar10 + dVar13 + dVar12) - (dVar12 * 0.0 + dVar13 * 0.0 + dVar10);
  return;
}

Assistant:

void trans_affine::scaling(double* x, double* y) const
    {
        double x1 = 0.0;
        double y1 = 0.0;
        double x2 = 1.0;
        double y2 = 1.0;
        trans_affine t(*this);
        t *= trans_affine_rotation(-rotation());
        t.transform(&x1, &y1);
        t.transform(&x2, &y2);
        *x = x2 - x1;
        *y = y2 - y1;
    }